

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTask.h
# Opt level: O3

void __thiscall
HighsTask::
Callable<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/mip/HighsMipSolverData.cpp:390:21)>
::operator()(Callable<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsMipSolverData_cpp:390:21)>
             *this)

{
  unique_ptr<HighsMipSolverData::SymmetryDetectionData,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
  *puVar1;
  SymmetryDetectionData *this_00;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  
  puVar1 = (this->functor).symData;
  lVar2 = std::chrono::_V2::system_clock::now();
  this_00 = (puVar1->_M_t).
            super___uniq_ptr_impl<HighsMipSolverData::SymmetryDetectionData,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
            ._M_t.
            super__Tuple_impl<0UL,_HighsMipSolverData::SymmetryDetectionData_*,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
            .super__Head_base<0UL,_HighsMipSolverData::SymmetryDetectionData_*,_false>._M_head_impl;
  HighsSymmetryDetection::run(&this_00->symDetection,&this_00->symmetries);
  lVar3 = std::chrono::_V2::system_clock::now();
  auVar4._0_8_ = (double)lVar3;
  auVar4._8_8_ = (double)lVar2;
  auVar4 = divpd(auVar4,_DAT_003cf2f0);
  ((puVar1->_M_t).
   super___uniq_ptr_impl<HighsMipSolverData::SymmetryDetectionData,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
   ._M_t.
   super__Tuple_impl<0UL,_HighsMipSolverData::SymmetryDetectionData_*,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
   .super__Head_base<0UL,_HighsMipSolverData::SymmetryDetectionData_*,_false>._M_head_impl)->
  detectionTime = auVar4._0_8_ - auVar4._8_8_;
  return;
}

Assistant:

virtual void operator()() override {
      F callFunctor = std::move(functor);
      callFunctor();
    }